

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st2010.hpp
# Opt level: O3

void bcl::st2010::
     generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  pointer pdVar1;
  pointer pdVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pvVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<double,_std::allocator<double>_> accum;
  allocator_type local_49;
  value_type local_48;
  vector<double,_std::allocator<double>_> local_40;
  
  pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar12 = (long)pdVar2 - (long)pdVar1 >> 3;
  local_48 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,lVar12 + 1,&local_48,&local_49);
  pdVar3 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar13 = 0.0;
  pdVar9 = pdVar3;
  pdVar8 = pdVar3;
  if (pdVar3 != pdVar4) {
    do {
      dVar13 = dVar13 + *pdVar8;
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != pdVar4);
    pdVar8 = pdVar3 + 1;
    if (pdVar8 != pdVar4) {
      dVar14 = *pdVar3;
      do {
        dVar15 = *pdVar8;
        pdVar7 = pdVar8;
        if (*pdVar8 <= dVar14) {
          dVar15 = dVar14;
          pdVar7 = pdVar9;
        }
        pdVar9 = pdVar7;
        dVar14 = dVar15;
        pdVar8 = pdVar8 + 1;
      } while (pdVar8 != pdVar4);
    }
  }
  dVar14 = *pdVar9;
  *local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  if (pdVar2 != pdVar1) {
    dVar15 = 0.0;
    lVar10 = 0;
    do {
      dVar15 = dVar15 + pdVar3[lVar10] / dVar13;
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10 + 1] = dVar15;
      lVar10 = lVar10 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar10);
    if (pdVar2 != pdVar1) {
      pvVar5 = (tm->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + (ulong)(lVar12 == 0);
      lVar10 = 0;
      do {
        lVar6 = *(long *)&pvVar5[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        lVar11 = 0;
        do {
          auVar19._0_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10 + 1] + dVar14 / dVar13;
          dVar15 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10] + dVar14 / dVar13;
          auVar18._8_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11 + 1] + 1.0;
          auVar18._0_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11 + 1];
          auVar19._8_8_ = auVar19._0_8_;
          auVar19 = minpd(auVar18,auVar19);
          auVar16._8_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11] + 1.0;
          auVar16._0_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
          auVar17._8_8_ = dVar15;
          auVar17._0_8_ = dVar15;
          auVar17 = maxpd(auVar16,auVar17);
          auVar20._0_8_ = auVar19._0_8_ - auVar17._0_8_;
          auVar20._8_8_ = auVar19._8_8_ - auVar17._8_8_;
          auVar17 = maxpd(ZEXT816(0),auVar20);
          *(double *)(lVar6 + lVar11 * 8) =
               (auVar17._8_8_ + auVar17._0_8_) / (pdVar3[lVar10] / dVar13);
          lVar11 = lVar11 + 1;
        } while (lVar12 != lVar11);
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar12);
    }
  }
  operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return;
}

Assistant:

static void generate_transition_matrix(VEC const& weights, MAT& tm) {
    using std::abs;
    std::size_t n = weights.size();
    std::vector<double> accum(n+1, 0);
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double shift = *(std::max_element(weights.begin(), weights.end())) / sum;
    accum[0] = 0;
    for (std::size_t i = 0; i < n; ++i) accum[i+1] = accum[i] + weights[i] / sum;

    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = 0; j < n; ++j) {
        tm[i][j] = (std::max(std::min(accum[i+1] + shift, accum[j+1]) -
                             std::max(accum[i] + shift, accum[j]), 0.0) +
                    std::max(std::min(accum[i+1] + shift, accum[j+1] + 1) -
                             std::max(accum[i] + shift, accum[j] + 1), 0.0)) / (weights[i] / sum);
      }
    }
  }